

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseNotationDecl(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  notationDeclSAXFunc p_Var2;
  int iVar3;
  xmlChar *in_RAX;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  char *msg;
  xmlParserInputPtr in;
  xmlChar *Pubid;
  
  in = ctxt->input;
  pxVar4 = in->cur;
  if ((((((*pxVar4 != '<') || (pxVar4[1] != '!')) || (pxVar4[2] != 'N')) ||
       (((pxVar4[3] != 'O' || (pxVar4[4] != 'T')) ||
        ((pxVar4[5] != 'A' || ((pxVar4[6] != 'T' || (pxVar4[7] != 'I')))))))) || (pxVar4[8] != 'O'))
     || (pxVar4[9] != 'N')) {
    return;
  }
  iVar1 = in->id;
  Pubid = in_RAX;
  if (((ctxt->progressive == 0) && (500 < (long)pxVar4 - (long)in->base)) &&
     ((long)in->end - (long)pxVar4 < 500)) {
    xmlSHRINK(ctxt);
    in = ctxt->input;
    pxVar4 = in->cur;
  }
  in->cur = pxVar4 + 10;
  in->col = in->col + 10;
  if (pxVar4[10] == '\0') {
    xmlParserInputGrow(in,0xfa);
  }
  iVar3 = xmlSkipBlankChars(ctxt);
  if (iVar3 == 0) {
    msg = "Space required after \'<!NOTATION\'\n";
  }
  else {
    pxVar4 = xmlParseName(ctxt);
    if (pxVar4 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_NOTATION_NOT_STARTED,(char *)0x0);
      return;
    }
    pxVar5 = xmlStrchr(pxVar4,':');
    if (pxVar5 != (xmlChar *)0x0) {
      xmlNsErr(ctxt,XML_NS_ERR_COLON,"colons are forbidden from notation names \'%s\'\n",pxVar4,
               (xmlChar *)0x0,(xmlChar *)0x0);
    }
    iVar3 = xmlSkipBlankChars(ctxt);
    if (iVar3 != 0) {
      pxVar5 = xmlParseExternalID(ctxt,&Pubid,0);
      xmlSkipBlankChars(ctxt);
      if (*ctxt->input->cur == '>') {
        if (iVar1 != ctxt->input->id) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "Notation declaration doesn\'t start and stop in the same entity\n");
        }
        xmlNextChar(ctxt);
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
           (p_Var2 = ctxt->sax->notationDecl, p_Var2 != (notationDeclSAXFunc)0x0)) {
          (*p_Var2)(ctxt->userData,pxVar4,Pubid,pxVar5);
        }
      }
      else {
        xmlFatalErr(ctxt,XML_ERR_NOTATION_NOT_FINISHED,(char *)0x0);
      }
      if (pxVar5 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar5);
      }
      if (Pubid == (xmlChar *)0x0) {
        return;
      }
      (*xmlFree)(Pubid);
      return;
    }
    msg = "Space required after the NOTATION name\'\n";
  }
  xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,msg);
  return;
}

Assistant:

void
xmlParseNotationDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    xmlChar *Pubid;
    xmlChar *Systemid;

    if (CMP10(CUR_PTR, '<', '!', 'N', 'O', 'T', 'A', 'T', 'I', 'O', 'N')) {
	int inputid = ctxt->input->id;
	SHRINK;
	SKIP(10);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after '<!NOTATION'\n");
	    return;
	}

        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_STARTED, NULL);
	    return;
	}
	if (xmlStrchr(name, ':') != NULL) {
	    xmlNsErr(ctxt, XML_NS_ERR_COLON,
		     "colons are forbidden from notation names '%s'\n",
		     name, NULL, NULL);
	}
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		     "Space required after the NOTATION name'\n");
	    return;
	}

	/*
	 * Parse the IDs.
	 */
	Systemid = xmlParseExternalID(ctxt, &Pubid, 0);
	SKIP_BLANKS;

	if (RAW == '>') {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                       "Notation declaration doesn't start and stop"
                               " in the same entity\n");
	    }
	    NEXT;
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->notationDecl != NULL))
		ctxt->sax->notationDecl(ctxt->userData, name, Pubid, Systemid);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_FINISHED, NULL);
	}
	if (Systemid != NULL) xmlFree(Systemid);
	if (Pubid != NULL) xmlFree(Pubid);
    }
}